

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O3

void __thiscall
Assimp::SMDImporter::ParseSkeletonElement
          (SMDImporter *this,char *szCurrent,char **szCurrentOut,int iTime)

{
  byte *pbVar1;
  pointer *ppMVar2;
  pointer this_00;
  uint uVar3;
  byte bVar4;
  pointer pBVar5;
  iterator __position;
  pointer pMVar6;
  Logger *this_01;
  ulong uVar7;
  ulong uVar8;
  byte *pbVar9;
  aiMatrix4x4t<float> temp;
  undefined8 local_f0;
  float local_e8 [2];
  undefined8 local_e0;
  float local_d8 [2];
  MatrixKey local_d0;
  
  local_e0 = 0;
  local_d8[0] = 0.0;
  local_f0 = 0;
  local_e8[0] = 0.0;
  pbVar9 = (byte *)szCurrent;
  while( true ) {
    uVar8 = (ulong)*pbVar9;
    if (0x20 < uVar8) break;
    if ((0x100000200U >> (uVar8 & 0x3f) & 1) == 0) {
      if ((0x3401UL >> (uVar8 & 0x3f) & 1) != 0) {
        this_01 = DefaultLogger::get();
        Logger::error(this_01,"Unexpected EOF/EOL while parsing bone index");
        while( true ) {
          bVar4 = *szCurrent;
          if ((bVar4 < 0xe) && ((0x2401U >> (bVar4 & 0x1f) & 1) != 0)) break;
          szCurrent = (char *)((byte *)szCurrent + 1);
        }
        while ((bVar4 == 0xd || (bVar4 == 10))) {
          pbVar9 = (byte *)szCurrent + 1;
          szCurrent = (char *)((byte *)szCurrent + 1);
          bVar4 = *pbVar9;
        }
        goto LAB_005d18d8;
      }
      break;
    }
    pbVar9 = pbVar9 + 1;
  }
  uVar7 = 0;
  szCurrent = (char *)pbVar9;
  if (0xf5 < (byte)(*pbVar9 - 0x3a)) {
    do {
      uVar3 = (uint)(byte)((char)uVar8 - 0x30) + (int)uVar7 * 10;
      uVar7 = (ulong)uVar3;
      pbVar1 = pbVar9 + 1;
      uVar8 = (ulong)*pbVar1;
      pbVar9 = pbVar9 + 1;
    } while (0xf5 < (byte)(*pbVar1 - 0x3a));
    uVar7 = (ulong)uVar3;
    szCurrent = (char *)pbVar9;
  }
  pBVar5 = (this->asBones).super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = ((long)(this->asBones).
                 super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pBVar5 >> 4) * -0x71c71c71c71c71c7;
  if (uVar8 < uVar7 || uVar8 - uVar7 == 0) {
    LogErrorNoThrow(this,"Bone index in skeleton section is out of range");
    while( true ) {
      bVar4 = *szCurrent;
      if ((bVar4 < 0xe) && ((0x2401U >> (bVar4 & 0x1f) & 1) != 0)) break;
      szCurrent = (char *)((byte *)szCurrent + 1);
    }
    while ((bVar4 == 0xd || (bVar4 == 10))) {
      pbVar9 = (byte *)szCurrent + 1;
      szCurrent = (char *)((byte *)szCurrent + 1);
      bVar4 = *pbVar9;
    }
  }
  else {
    local_d0.matrix.a1 = 1.0;
    local_d0.matrix.a2 = 0.0;
    local_d0.matrix.a3 = 0.0;
    local_d0.matrix.a4 = 0.0;
    local_d0.matrix.b1 = 0.0;
    local_d0.matrix.b2 = 1.0;
    local_d0.matrix.b3 = 0.0;
    local_d0.matrix.b4 = 0.0;
    local_d0.matrix.c1 = 0.0;
    local_d0.matrix.c2 = 0.0;
    local_d0.matrix.c3 = 1.0;
    local_d0.matrix.c4 = 0.0;
    local_d0.matrix.d1 = 0.0;
    local_d0.matrix.d2 = 0.0;
    local_d0.matrix.d3 = 0.0;
    local_d0.matrix.d4 = 1.0;
    local_d0.matrixAbsolute.a1 = 1.0;
    local_d0.matrixAbsolute.a2 = 0.0;
    local_d0.matrixAbsolute.a3 = 0.0;
    local_d0.matrixAbsolute.a4 = 0.0;
    local_d0.matrixAbsolute.b1 = 0.0;
    local_d0.matrixAbsolute.b2 = 1.0;
    local_d0.matrixAbsolute.b3 = 0.0;
    local_d0.matrixAbsolute.b4 = 0.0;
    local_d0.matrixAbsolute.c1 = 0.0;
    local_d0.matrixAbsolute.c2 = 0.0;
    local_d0.matrixAbsolute.c3 = 1.0;
    local_d0.matrixAbsolute.c4 = 0.0;
    local_d0.matrixAbsolute.d1 = 0.0;
    local_d0.matrixAbsolute.d2 = 0.0;
    local_d0.matrixAbsolute.d3 = 0.0;
    local_d0.matrixAbsolute.d4 = 1.0;
    local_d0.vPos.x = 0.0;
    local_d0.vPos.y = 0.0;
    local_d0.vPos.z = 0.0;
    local_d0.vRot.x = 0.0;
    local_d0.vRot.y = 0.0;
    local_d0.vRot.z = 0.0;
    local_d0.dTime = 0.0;
    __position._M_current =
         *(pointer *)
          ((long)&pBVar5[uVar7].sAnim.asKeys.
                  super__Vector_base<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
          + 8);
    if (__position._M_current ==
        *(pointer *)
         ((long)&pBVar5[uVar7].sAnim.asKeys.
                 super__Vector_base<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
         + 0x10)) {
      std::
      vector<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
      ::_M_realloc_insert<Assimp::SMD::Bone::Animation::MatrixKey>
                (&pBVar5[uVar7].sAnim.asKeys,__position,&local_d0);
    }
    else {
      memcpy(__position._M_current,&local_d0,0xa0);
      ppMVar2 = (pointer *)
                ((long)&pBVar5[uVar7].sAnim.asKeys.
                        super__Vector_base<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
                + 8);
      *ppMVar2 = *ppMVar2 + 1;
    }
    pMVar6 = *(pointer *)
              ((long)&pBVar5[uVar7].sAnim.asKeys.
                      super__Vector_base<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
              + 8);
    this_00 = pMVar6 + -1;
    pMVar6[-1].dTime = (double)iTime;
    for (pbVar9 = (byte *)szCurrent; uVar8 = (ulong)*pbVar9, uVar8 < 0x21; pbVar9 = pbVar9 + 1) {
      if ((0x100000200U >> (uVar8 & 0x3f) & 1) == 0) {
        if ((0x3401UL >> (uVar8 & 0x3f) & 1) != 0) {
          LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing bone.pos.x");
          while( true ) {
            bVar4 = *szCurrent;
            if ((bVar4 < 0xe) && ((0x2401U >> (bVar4 & 0x1f) & 1) != 0)) break;
            szCurrent = (char *)((byte *)szCurrent + 1);
          }
          while ((bVar4 == 0xd || (bVar4 == 10))) {
            pbVar9 = (byte *)szCurrent + 1;
            szCurrent = (char *)((byte *)szCurrent + 1);
            bVar4 = *pbVar9;
          }
          goto LAB_005d18d8;
        }
        break;
      }
    }
    szCurrent = fast_atoreal_move<float>((char *)pbVar9,(float *)&local_e0,true);
    for (pbVar9 = (byte *)szCurrent; uVar8 = (ulong)*pbVar9, uVar8 < 0x21; pbVar9 = pbVar9 + 1) {
      if ((0x100000200U >> (uVar8 & 0x3f) & 1) == 0) {
        if ((0x3401UL >> (uVar8 & 0x3f) & 1) != 0) {
          LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing bone.pos.y");
          while( true ) {
            bVar4 = *szCurrent;
            if ((bVar4 < 0xe) && ((0x2401U >> (bVar4 & 0x1f) & 1) != 0)) break;
            szCurrent = (char *)((byte *)szCurrent + 1);
          }
          while ((bVar4 == 0xd || (bVar4 == 10))) {
            pbVar9 = (byte *)szCurrent + 1;
            szCurrent = (char *)((byte *)szCurrent + 1);
            bVar4 = *pbVar9;
          }
          goto LAB_005d18d8;
        }
        break;
      }
    }
    szCurrent = fast_atoreal_move<float>((char *)pbVar9,(float *)((long)&local_e0 + 4),true);
    for (pbVar9 = (byte *)szCurrent; uVar8 = (ulong)*pbVar9, uVar8 < 0x21; pbVar9 = pbVar9 + 1) {
      if ((0x100000200U >> (uVar8 & 0x3f) & 1) == 0) {
        if ((0x3401UL >> (uVar8 & 0x3f) & 1) != 0) {
          LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing bone.pos.z");
          while( true ) {
            bVar4 = *szCurrent;
            if ((bVar4 < 0xe) && ((0x2401U >> (bVar4 & 0x1f) & 1) != 0)) break;
            szCurrent = (char *)((byte *)szCurrent + 1);
          }
          while ((bVar4 == 0xd || (bVar4 == 10))) {
            pbVar9 = (byte *)szCurrent + 1;
            szCurrent = (char *)((byte *)szCurrent + 1);
            bVar4 = *pbVar9;
          }
          goto LAB_005d18d8;
        }
        break;
      }
    }
    szCurrent = fast_atoreal_move<float>((char *)pbVar9,local_d8,true);
    for (pbVar9 = (byte *)szCurrent; uVar8 = (ulong)*pbVar9, uVar8 < 0x21; pbVar9 = pbVar9 + 1) {
      if ((0x100000200U >> (uVar8 & 0x3f) & 1) == 0) {
        if ((0x3401UL >> (uVar8 & 0x3f) & 1) != 0) {
          LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing bone.rot.x");
          while( true ) {
            bVar4 = *szCurrent;
            if ((bVar4 < 0xe) && ((0x2401U >> (bVar4 & 0x1f) & 1) != 0)) break;
            szCurrent = (char *)((byte *)szCurrent + 1);
          }
          while ((bVar4 == 0xd || (bVar4 == 10))) {
            pbVar9 = (byte *)szCurrent + 1;
            szCurrent = (char *)((byte *)szCurrent + 1);
            bVar4 = *pbVar9;
          }
          goto LAB_005d18d8;
        }
        break;
      }
    }
    szCurrent = fast_atoreal_move<float>((char *)pbVar9,(float *)&local_f0,true);
    for (pbVar9 = (byte *)szCurrent; uVar8 = (ulong)*pbVar9, uVar8 < 0x21; pbVar9 = pbVar9 + 1) {
      if ((0x100000200U >> (uVar8 & 0x3f) & 1) == 0) {
        if ((0x3401UL >> (uVar8 & 0x3f) & 1) != 0) {
          LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing bone.rot.y");
          while( true ) {
            bVar4 = *szCurrent;
            if ((bVar4 < 0xe) && ((0x2401U >> (bVar4 & 0x1f) & 1) != 0)) break;
            szCurrent = (char *)((byte *)szCurrent + 1);
          }
          while ((bVar4 == 0xd || (bVar4 == 10))) {
            pbVar9 = (byte *)szCurrent + 1;
            szCurrent = (char *)((byte *)szCurrent + 1);
            bVar4 = *pbVar9;
          }
          goto LAB_005d18d8;
        }
        break;
      }
    }
    szCurrent = fast_atoreal_move<float>((char *)pbVar9,(float *)((long)&local_f0 + 4),true);
    for (pbVar9 = (byte *)szCurrent; uVar8 = (ulong)*pbVar9, uVar8 < 0x21; pbVar9 = pbVar9 + 1) {
      if ((0x100000200U >> (uVar8 & 0x3f) & 1) == 0) {
        if ((0x3401UL >> (uVar8 & 0x3f) & 1) != 0) {
          LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing bone.rot.z");
          while( true ) {
            bVar4 = *szCurrent;
            if ((bVar4 < 0xe) && ((0x2401U >> (bVar4 & 0x1f) & 1) != 0)) break;
            szCurrent = (char *)((byte *)szCurrent + 1);
          }
          while ((bVar4 == 0xd || (bVar4 == 10))) {
            pbVar9 = (byte *)szCurrent + 1;
            szCurrent = (char *)((byte *)szCurrent + 1);
            bVar4 = *pbVar9;
          }
          goto LAB_005d18d8;
        }
        break;
      }
    }
    szCurrent = fast_atoreal_move<float>((char *)pbVar9,local_e8,true);
    aiMatrix4x4t<float>::FromEulerAnglesXYZ
              (&this_00->matrix,(float)local_f0,local_f0._4_4_,local_e8[0]);
    local_d0.matrix.a1 = 1.0;
    local_d0.matrix.a2 = 0.0;
    local_d0.matrix.a3 = 0.0;
    local_d0.matrix.a4 = (float)local_e0;
    local_d0.matrix.b1 = 0.0;
    local_d0.matrix.b2 = 1.0;
    local_d0.matrix._24_8_ = local_e0 & 0xffffffff00000000;
    local_d0.matrix.c1 = 0.0;
    local_d0.matrix.c2 = 0.0;
    local_d0.matrix.c3 = 1.0;
    local_d0.matrix.c4 = local_d8[0];
    local_d0.matrix.d1 = 0.0;
    local_d0.matrix.d2 = 0.0;
    local_d0.matrix.d3 = 0.0;
    local_d0.matrix.d4 = 1.0;
    aiMatrix4x4t<float>::operator*=(&local_d0.matrix,&this_00->matrix);
    pMVar6[-1].matrix.d1 = local_d0.matrix.d1;
    pMVar6[-1].matrix.d2 = local_d0.matrix.d2;
    pMVar6[-1].matrix.d3 = local_d0.matrix.d3;
    pMVar6[-1].matrix.d4 = local_d0.matrix.d4;
    pMVar6[-1].matrix.c1 = local_d0.matrix.c1;
    pMVar6[-1].matrix.c2 = local_d0.matrix.c2;
    pMVar6[-1].matrix.c3 = local_d0.matrix.c3;
    pMVar6[-1].matrix.c4 = local_d0.matrix.c4;
    pMVar6[-1].matrix.b1 = local_d0.matrix.b1;
    pMVar6[-1].matrix.b2 = local_d0.matrix.b2;
    pMVar6[-1].matrix.b3 = local_d0.matrix.b3;
    pMVar6[-1].matrix.b4 = local_d0.matrix.b4;
    (this_00->matrix).a1 = local_d0.matrix.a1;
    (this_00->matrix).a2 = local_d0.matrix.a2;
    pMVar6[-1].matrix.a3 = local_d0.matrix.a3;
    pMVar6[-1].matrix.a4 = local_d0.matrix.a4;
    pMVar6[-1].vPos.z = local_d8[0];
    pMVar6[-1].vPos.x = (float)local_e0;
    pMVar6[-1].vPos.y = (float)local_e0._4_4_;
    pMVar6[-1].vRot.x = (float)local_f0;
    pMVar6[-1].vRot.y = local_f0._4_4_;
    pMVar6[-1].vRot.z = local_e8[0];
    while( true ) {
      bVar4 = *szCurrent;
      if ((bVar4 < 0xe) && ((0x2401U >> (bVar4 & 0x1f) & 1) != 0)) break;
      szCurrent = (char *)((byte *)szCurrent + 1);
    }
    while ((bVar4 == 0xd || (bVar4 == 10))) {
      pbVar9 = (byte *)szCurrent + 1;
      szCurrent = (char *)((byte *)szCurrent + 1);
      bVar4 = *pbVar9;
    }
  }
LAB_005d18d8:
  this->iLineNumber = this->iLineNumber + 1;
  *szCurrentOut = szCurrent;
  return;
}

Assistant:

void SMDImporter::ParseSkeletonElement(const char* szCurrent, const char** szCurrentOut,int iTime) {
    aiVector3D vPos;
    aiVector3D vRot;

    unsigned int iBone  = 0;
    if(!ParseUnsignedInt(szCurrent,&szCurrent,iBone)) {
        ASSIMP_LOG_ERROR("Unexpected EOF/EOL while parsing bone index");
        SMDI_PARSE_RETURN;
    }
    if (iBone >= asBones.size()) {
        LogErrorNoThrow("Bone index in skeleton section is out of range");
        SMDI_PARSE_RETURN;
    }
    SMD::Bone& bone = asBones[iBone];

    bone.sAnim.asKeys.push_back(SMD::Bone::Animation::MatrixKey());
    SMD::Bone::Animation::MatrixKey& key = bone.sAnim.asKeys.back();

    key.dTime = (double)iTime;
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vPos.x)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing bone.pos.x");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vPos.y)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing bone.pos.y");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vPos.z)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing bone.pos.z");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vRot.x)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing bone.rot.x");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vRot.y)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing bone.rot.y");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vRot.z)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing bone.rot.z");
        SMDI_PARSE_RETURN;
    }
    // build the transformation matrix of the key
    key.matrix.FromEulerAnglesXYZ(vRot.x,vRot.y,vRot.z); {
        aiMatrix4x4 mTemp;
        mTemp.a4 = vPos.x;
        mTemp.b4 = vPos.y;
        mTemp.c4 = vPos.z;
        key.matrix = mTemp * key.matrix;
    }
    key.vPos = vPos;
    key.vRot = vRot;
    // go to the beginning of the next line
    SMDI_PARSE_RETURN;
}